

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterBarV<unsigned_long_long>>
               (char *label_id,GetterBarV<unsigned_long_long> *getter,double width)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  unsigned_long_long *puVar7;
  ImPlotPlot *pIVar8;
  unsigned_long_long uVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar12;
  int iVar13;
  int iVar14;
  ImPlotRange *pIVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar11 = BeginItem(label_id,1);
  pIVar10 = GImPlot;
  if (bVar11) {
    dVar24 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar12 = getter->Count, 0 < iVar12)) {
      dVar16 = getter->XShift;
      puVar7 = getter->Ys;
      iVar14 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar8 = GImPlot->CurrentPlot;
      iVar4 = pIVar8->CurrentYAxis;
      uVar5 = (pIVar8->XAxis).Flags;
      pIVar15 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar8->YAxis[iVar4].Flags;
      iVar13 = 0;
      dVar18 = 0.0;
      do {
        dVar19 = dVar16 + dVar18;
        uVar9 = *(unsigned_long_long *)
                 ((long)puVar7 +
                 (long)(((iVar14 + iVar13) % iVar12 + iVar12) % iVar12) * (long)iVar3);
        auVar22._8_4_ = (int)(uVar9 >> 0x20);
        auVar22._0_8_ = uVar9;
        auVar22._12_4_ = 0x45300000;
        dVar20 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
        dVar21 = dVar19 - dVar24;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001f54cf:
            if ((0.0 < dVar21) || ((uVar5 & 0x20) == 0)) {
              dVar1 = (pIVar10->ExtentsX).Min;
              dVar23 = dVar21;
              if (dVar1 <= dVar21) {
                dVar23 = dVar1;
              }
              (pIVar10->ExtentsX).Min = dVar23;
              dVar1 = (pIVar10->ExtentsX).Max;
              dVar23 = dVar21;
              if (dVar21 <= dVar1) {
                dVar23 = dVar1;
              }
              (pIVar10->ExtentsX).Max = dVar23;
            }
          }
        }
        else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar4].Range.Min <= dVar20)) &&
                (dVar20 <= pIVar8->YAxis[iVar4].Range.Max)) goto LAB_001f54cf;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar9 != 0) || ((uVar6 & 0x20) == 0)) {
LAB_001f5541:
            dVar21 = dVar20;
            if (pIVar15->Min <= dVar20) {
              dVar21 = pIVar15->Min;
            }
            pIVar15->Min = dVar21;
            dVar21 = pIVar10->ExtentsY[iVar4].Max;
            if (dVar20 <= dVar21) {
              dVar20 = dVar21;
            }
            pIVar10->ExtentsY[iVar4].Max = dVar20;
          }
        }
        else if ((((pIVar8->XAxis).Range.Min <= dVar21) && (dVar21 <= (pIVar8->XAxis).Range.Max)) &&
                (local_44 = (byte)((uVar6 & 0x20) >> 5), (uVar9 == 0 & local_44) == 0))
        goto LAB_001f5541;
        dVar19 = dVar19 + dVar24;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar19) < 0x7ff0000000000000) {
LAB_001f5597:
            if ((0.0 < dVar19) || ((uVar5 & 0x20) == 0)) {
              dVar20 = (pIVar10->ExtentsX).Min;
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              (pIVar10->ExtentsX).Min = dVar21;
              dVar20 = (pIVar10->ExtentsX).Max;
              dVar21 = dVar19;
              if (dVar19 <= dVar20) {
                dVar21 = dVar20;
              }
              (pIVar10->ExtentsX).Max = dVar21;
            }
          }
        }
        else if ((((long)ABS(dVar19) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar4].Range.Min <= 0.0)) && (0.0 <= pIVar8->YAxis[iVar4].Range.Max)
                ) goto LAB_001f5597;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar6 & 0x20) == 0) {
LAB_001f55f5:
            dVar20 = 0.0;
            if (pIVar15->Min <= 0.0) {
              dVar20 = pIVar15->Min;
            }
            pIVar15->Min = dVar20;
            dVar20 = pIVar10->ExtentsY[iVar4].Max;
            dVar19 = 0.0;
            if (0.0 <= dVar20) {
              dVar19 = dVar20;
            }
            pIVar10->ExtentsY[iVar4].Max = dVar19;
          }
        }
        else if ((((uVar6 & 0x20) == 0) && ((pIVar8->XAxis).Range.Min <= dVar19)) &&
                (dVar19 <= (pIVar8->XAxis).Range.Max)) goto LAB_001f55f5;
        dVar18 = dVar18 + 1.0;
        iVar13 = iVar13 + 1;
      } while (iVar12 != iVar13);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 1);
    iVar12 = getter->Count;
    if (0 < iVar12) {
      bVar11 = (pIVar10->NextItemData).RenderFill;
      bVar2 = (pIVar10->NextItemData).RenderLine;
      iVar14 = 0;
      do {
        uVar9 = *(unsigned_long_long *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar14) % iVar12 + iVar12) % iVar12) *
                 (long)getter->Stride);
        if (uVar9 != 0) {
          auVar17._8_4_ = (int)(uVar9 >> 0x20);
          auVar17._0_8_ = uVar9;
          auVar17._12_4_ = 0x45300000;
          dVar16 = (double)iVar14 + getter->XShift;
          local_38 = PlotToPixels(dVar16 - dVar24,
                                  (auVar17._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0),-1)
          ;
          local_40 = PlotToPixels(dVar16 + dVar24,0.0,-1);
          if ((pIVar10->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar11 ^ 1U | col != col_00) & bVar2) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar10->NextItemData).LineWeight);
          }
        }
        iVar14 = iVar14 + 1;
        iVar12 = getter->Count;
      } while (iVar14 < iVar12);
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}